

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_util.h
# Opt level: O0

string * anon_unknown.dwarf_15e08f::trim(string *str,string *whitespace)

{
  long lVar1;
  ulong in_RDX;
  string *in_RSI;
  string *in_RDI;
  size_type strBegin;
  size_type strEnd;
  
  lVar1 = std::__cxx11::string::find_last_not_of(in_RSI,in_RDX);
  if (lVar1 == -1) {
    std::__cxx11::string::string((string *)in_RDI);
  }
  else {
    std::__cxx11::string::erase((ulong)in_RSI,lVar1 + 1);
    std::__cxx11::string::find_first_not_of(in_RSI,in_RDX);
    std::__cxx11::string::erase((ulong)in_RSI,0);
    std::__cxx11::string::string((string *)in_RDI,in_RSI);
  }
  return in_RDI;
}

Assistant:

std::string trim(std::string&& str,
			 const std::string& whitespace = " \t\n")
	{
		const auto strEnd = str.find_last_not_of(whitespace);
		if (strEnd==std::string::npos)
			return {}; // no content
		str.erase(strEnd+1);
		
		const auto strBegin = str.find_first_not_of(whitespace);
		str.erase(0, strBegin);
		
		return std::move(str);
	}